

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

string * hexdumpunit_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t bytelen,DumpUnitType unittype
                   )

{
  long lVar1;
  size_t len;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar1 = (long)(1 << ((byte)unittype & 0x1f));
  len = bytelen;
  for (uVar2 = 0; uVar2 < bytelen; uVar2 = uVar2 + lVar1) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    dumponeunit_abi_cxx11_(&local_50,buf + uVar2,len,unittype);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    len = len - lVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexdumpunit(const uint8_t *buf, size_t bytelen, DumpUnitType unittype)
{
    std::string str;

    str.reserve(bytelen*3);
    for (size_t i=0 ; i<bytelen ; i+=DumpUnitSize(unittype)) {
        if (!str.empty())
            str += " ";
        str += dumponeunit(buf+i, bytelen-i, unittype);
    }

    return str;
}